

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
pbrt::SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
          (SceneRepresentation *this,FileLoc *loc,char *fmt,FileLoc *args)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 8) = 1;
  Error<pbrt::FileLoc&>((FileLoc *)this,(char *)loc,(FileLoc *)fmt);
  return;
}

Assistant:

void ErrorExitDeferred(const FileLoc *loc, const char *fmt, Args &&... args) const {
        errorExit = true;
        Error(loc, fmt, std::forward<Args>(args)...);
    }